

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eddsa.c
# Opt level: O0

void i2p_eddsa_keygen(i2p_eddsa *ed)

{
  uchar *in_RDI;
  ge_p3 A;
  uint8_t az [64];
  uchar *in_stack_000000f8;
  ge_p3 *in_stack_00000100;
  ge_p3 *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  byte local_48 [31];
  byte local_29;
  uchar *local_8;
  
  local_8 = in_RDI;
  RAND_bytes(in_RDI,0x20);
  SHA512(local_8,0x20,local_48);
  local_48[0] = local_48[0] & 0xf8;
  local_29 = local_29 & 0x3f | 0x40;
  crypto_sign_ed25519_ref10_ge_scalarmult_base(in_stack_00000100,in_stack_000000f8);
  crypto_sign_ed25519_ref10_ge_p3_tobytes(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return;
}

Assistant:

void i2p_eddsa_keygen(struct i2p_eddsa * ed)
{
  uint8_t az[64];
  ge_p3 A;

  RAND_bytes(ed->key,32);
  SHA512(ed->key,32,az);
  az[0] &= 0xf8;
  az[31] &= 0x3f;
  az[31] |= 0x40;

  ge_scalarmult_base(&A,az);
  ge_p3_tobytes(ed->key + 32,&A);
}